

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedQueue.h
# Opt level: O2

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>
::dequeue(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *__return_storage_ptr__,
         ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>
         *this)

{
  _Elt_pointer rhs;
  deque<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
  *this_00;
  unique_lock<std::mutex> lock;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  elem;
  unique_lock<std::mutex> local_90;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_80;
  
  std::unique_lock<std::mutex>::unique_lock(&local_90,&this->mutex);
  std::condition_variable::
  wait<ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>::dequeue()::_lambda()_1_>
            (&this->c,&local_90,(anon_class_8_1_8991fb9c)this);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_80,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rhs = (this->priority_queue).
        super__Deque_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->priority_queue).
      super__Deque_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == rhs) {
    this_00 = &this->queue;
    rhs = (this->queue).
          super__Deque_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  else {
    this_00 = &this->priority_queue;
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::operator=(&local_80,rhs);
  std::
  deque<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
  ::pop_front(this_00);
  this->size = this->size - 1;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(__return_storage_ptr__,&local_80);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_80);
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  return __return_storage_ptr__;
}

Assistant:

T dequeue () {
        std::unique_lock<std::mutex> lock(mutex);
        c.wait(lock, [this]{ return size; });

        T elem;

        if (priority_queue.empty()) {
            elem = std::move(queue.front());
            queue.pop_front();
        } else {
            elem = std::move(priority_queue.front());
            priority_queue.pop_front();
        }
        size--;

        return std::move(elem);
    }